

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

UVec3 __thiscall
deqp::gles31::Functional::GlobalInvocationIDCase::computeReference
          (GlobalInvocationIDCase *this,UVec3 *numWorkGroups,UVec3 *workGroupSize,UVec3 *workGroupID
          ,UVec3 *localInvocationID)

{
  Vector<unsigned_int,_3> *in_R9;
  Vector<unsigned_int,_3> VVar1;
  UVec3 UVar2;
  tcu local_24 [12];
  
  tcu::operator*(local_24,localInvocationID,workGroupID);
  VVar1 = tcu::operator+((tcu *)this,(Vector<unsigned_int,_3> *)local_24,in_R9);
  UVar2.m_data[2] = VVar1.m_data[2];
  UVar2.m_data._0_8_ = this;
  return (UVec3)UVar2.m_data;
}

Assistant:

UVec3 computeReference (const UVec3& numWorkGroups, const UVec3& workGroupSize, const UVec3& workGroupID, const UVec3& localInvocationID) const
	{
		DE_UNREF(numWorkGroups);
		return workGroupID * workGroupSize + localInvocationID;
	}